

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockNamedValueHandlerRepository_installMultipleComparators_TestShell::createTest
          (TEST_MockNamedValueHandlerRepository_installMultipleComparators_TestShell *this)

{
  Utest *this_00;
  TEST_MockNamedValueHandlerRepository_installMultipleComparators_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                                  ,0x61);
  TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test::
  TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test
            ((TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockNamedValueHandlerRepository, installMultipleComparators)
{
    TypeForTestingExpectedFunctionCallComparator comparator1, comparator2, comparator3;
    MockNamedValueComparatorsAndCopiersRepository repository;
    repository.installComparator("type1", comparator1);
    repository.installComparator("type2", comparator2);
    repository.installComparator("type3", comparator3);
    POINTERS_EQUAL(&comparator3, repository.getComparatorForType("type3"));
    POINTERS_EQUAL(&comparator2, repository.getComparatorForType("type2"));
    POINTERS_EQUAL(&comparator1, repository.getComparatorForType("type1"));
}